

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

uint64_t duckdb::NumericRangeInfo::ListLength
                   (int64_t start_value,int64_t end_value,int64_t increment_value,
                   bool inclusive_bound)

{
  hugeint_t a;
  undefined1 auVar1 [16];
  bool bVar2;
  InvalidInputException *this;
  undefined3 in_register_00000009;
  undefined4 uVar3;
  undefined4 in_register_0000000c;
  hugeint_t hVar4;
  hugeint_t input;
  hugeint_t total_values;
  unsigned_long result;
  hugeint_t increment;
  hugeint_t total_diff;
  uint64_t in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff60;
  Hugeint *this_00;
  uint64_t local_98;
  string local_90;
  hugeint_t local_70;
  hugeint_t local_60;
  hugeint_t local_50;
  hugeint_t local_40;
  
  if (((increment_value == 0) || (end_value < start_value && 0 < increment_value)) ||
     (uVar3 = CONCAT31(in_register_00000009,increment_value < 0),
     start_value < end_value && increment_value < 0)) {
    local_90._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    hugeint_t::hugeint_t((hugeint_t *)&local_90,end_value);
    hugeint_t::hugeint_t(&local_70,start_value);
    hugeint_t::operator-((hugeint_t *)&local_90,&local_70);
    hVar4.upper = in_stack_ffffffffffffff60;
    hVar4.lower = in_stack_ffffffffffffff58;
    local_40 = AbsValue<duckdb::hugeint_t>(hVar4);
    hugeint_t::hugeint_t(&local_50,increment_value);
    a.upper = in_stack_ffffffffffffff60;
    a.lower = in_stack_ffffffffffffff58;
    local_70 = AbsValue<duckdb::hugeint_t>(a);
    hVar4 = hugeint_t::operator/(&local_40,&local_70);
    this_00 = (Hugeint *)hVar4.lower;
    local_98 = hVar4.upper;
    local_90._0_16_ = hugeint_t::operator%(&local_40,&local_70);
    hugeint_t::hugeint_t(&local_60,0);
    bVar2 = hugeint_t::operator==((hugeint_t *)&local_90,&local_60);
    if ((!bVar2) || (inclusive_bound)) {
      hugeint_t::hugeint_t((hugeint_t *)&local_90,1);
      hugeint_t::operator+=((hugeint_t *)&stack0xffffffffffffff60,(hugeint_t *)&local_90);
    }
    hugeint_t::hugeint_t((hugeint_t *)&local_90,0xffffffff);
    bVar2 = hugeint_t::operator>((hugeint_t *)&stack0xffffffffffffff60,(hugeint_t *)&local_90);
    if (bVar2) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Lists larger than 2^32 elements are not supported","");
      InvalidInputException::InvalidInputException(this,&local_90);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_90._M_string_length;
    local_90._0_16_ = auVar1 << 0x40;
    input.upper = (int64_t)&local_90;
    input.lower = local_98;
    Hugeint::TryCast<unsigned_long>(this_00,input,(uint64_t *)CONCAT44(in_register_0000000c,uVar3));
  }
  return (uint64_t)local_90._M_dataplus._M_p;
}

Assistant:

static uint64_t ListLength(int64_t start_value, int64_t end_value, int64_t increment_value, bool inclusive_bound) {
		if (increment_value == 0) {
			return 0;
		}
		if (start_value > end_value && increment_value > 0) {
			return 0;
		}
		if (start_value < end_value && increment_value < 0) {
			return 0;
		}
		hugeint_t total_diff = AbsValue(hugeint_t(end_value) - hugeint_t(start_value));
		hugeint_t increment = AbsValue(hugeint_t(increment_value));
		hugeint_t total_values = total_diff / increment;
		if (total_diff % increment == 0) {
			if (inclusive_bound) {
				total_values += 1;
			}
		} else {
			total_values += 1;
		}
		if (total_values > NumericLimits<uint32_t>::Maximum()) {
			throw InvalidInputException("Lists larger than 2^32 elements are not supported");
		}
		return Hugeint::Cast<uint64_t>(total_values);
	}